

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

bool __thiscall CMU462::StaticScene::Sphere::intersect(Sphere *this,Ray *ray,Intersection *isect)

{
  bool bVar1;
  double dVar2;
  double *in_RDX;
  double *in_RSI;
  Ray *in_RDI;
  bool result;
  double first_hit;
  double t2;
  double t1;
  Vector3D *in_stack_ffffffffffffff78;
  Vector3D *in_stack_ffffffffffffff90;
  Sphere *in_stack_ffffffffffffff98;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  double local_30;
  double local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = test((Sphere *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,in_RSI
               ,in_RDX);
  if (0.0 <= local_28) {
    local_38 = local_28;
  }
  else {
    local_38 = local_30;
  }
  if (((!bVar1) || (in_RSI[8] < local_38)) || (local_38 < in_RSI[7])) {
    bVar1 = false;
  }
  else {
    in_RSI[8] = local_38;
    *in_RDX = local_38;
    Vector3D::operator*(in_stack_ffffffffffffff78,(double *)in_RDI);
    Vector3D::operator+(in_stack_ffffffffffffff78,(Vector3D *)in_RDI);
    normal(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_RDX[2] = local_58;
    in_RDX[3] = local_50;
    in_RDX[4] = local_48;
    dVar2 = (double)(**(code **)(in_RDI->depth + 0x18))();
    in_RDX[5] = dVar2;
    in_RDX[1] = (double)in_RDI;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Sphere::intersect(const Ray& ray, Intersection* isect) const {
		// TODO (PathTracer):
		// Implement ray - sphere intersection.
		// Note again that you might want to use the the Sphere::test helper here.
		// When an intersection takes place, the Intersection data should be updated
		// correspondingly.
		double t1, t2, first_hit;
		bool result = test(ray, t1, t2);

		// take into consideration when the origin of the
		// ray is inside the sphere
		if (t1 < 0) first_hit = t2;
		else first_hit = t1;

		if (result && first_hit <= ray.max_t && first_hit >= ray.min_t) {
			ray.max_t = first_hit;

			isect->t = first_hit;
			isect->n = normal(ray.o+ray.d*first_hit);
			isect->bsdf = get_bsdf();
			isect->primitive = this;

			return true;
		}
		else return false;
	}